

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void (anonymous_namespace)::
     time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
               (_func_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *f,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,int n,
               string *label)

{
  ostream *poVar1;
  rep rVar2;
  duration<long,_std::ratio<1L,_1000L>_> local_60;
  duration<long,_std::ratio<1L,_1000L>_> e;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> res;
  int i;
  timer t;
  string *label_local;
  int n_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local;
  _func_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *f_local;
  
  t.start_.__d.__r = (time_point)(time_point)label;
  anon_unknown.dwarf_d849::timer::timer((timer *)&stack0xffffffffffffffd0);
  for (res.field_2._12_4_ = 0; (int)res.field_2._12_4_ < n;
      res.field_2._12_4_ = res.field_2._12_4_ + 1) {
    (*f)((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)&e,arg);
    std::__cxx11::u16string::~u16string((u16string *)&e);
  }
  local_60 = timer::elapsed<std::chrono::duration<long,std::ratio<1l,1000l>>>
                       ((timer *)&stack0xffffffffffffffd0);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)t.start_.__d.__r);
  poVar1 = std::operator<<(poVar1," took ");
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_60);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1,"ms\n");
  return;
}

Assistant:

void time_function_call(Func f, const Arg& arg, int n, const string& label)
{
    timer t;
    for (int i = 0; i < n; i++) {
        volatile auto res = f(arg);
    }
    auto e = t.elapsed();
    std::cout << label << " took " << e.count() << "ms\n";
}